

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_test.cc
# Opt level: O2

void __thiscall
bssl::anon_unknown_0::SSLVersionTest_DoubleSSLError_Test::TestBody
          (SSLVersionTest_DoubleSSLError_Test *this)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  char *message;
  char *in_R9;
  UniquePtr<BIO> server_bio;
  UniquePtr<BIO> client_bio;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_d0;
  UniquePtr<SSL> client_outer;
  AssertionResult gtest_ar_;
  UniquePtr<SSL> server_outer;
  UniquePtr<BIO_METHOD> bio_method;
  AssertHelper local_a0;
  AssertionResult gtest_ar;
  int client_err;
  
  gtest_ar.success_ = false;
  gtest_ar._1_7_ = 0;
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  bVar1 = SSLVersionTest::Connect(&this->super_SSLVersionTest,(ClientConfig *)&gtest_ar);
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  gtest_ar_.success_ = bVar1;
  ClientConfig::~ClientConfig((ClientConfig *)&gtest_ar);
  if (gtest_ar_.success_ == false) {
    testing::Message::Message((Message *)&bio_method);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar,(internal *)&gtest_ar_,(AssertionResult *)"Connect()","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&client_bio,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
               ,0x2032,(char *)gtest_ar._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&client_bio,(Message *)&bio_method);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&client_bio);
    std::__cxx11::string::~string((string *)&gtest_ar);
    if ((__uniq_ptr_impl<bio_method_st,_bssl::internal::Deleter>)
        bio_method._M_t.super___uniq_ptr_impl<bio_method_st,_bssl::internal::Deleter>._M_t.
        super__Tuple_impl<0UL,_bio_method_st_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_bio_method_st_*,_false>._M_head_impl !=
        (__uniq_ptr_impl<bio_method_st,_bssl::internal::Deleter>)0x0) {
      (**(code **)(*(long *)bio_method._M_t.
                            super___uniq_ptr_impl<bio_method_st,_bssl::internal::Deleter>._M_t.
                            super__Tuple_impl<0UL,_bio_method_st_*,_bssl::internal::Deleter>.
                            super__Head_base<0UL,_bio_method_st_*,_false>._M_head_impl + 8))();
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_.message_);
    return;
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  bio_method._M_t.super___uniq_ptr_impl<bio_method_st,_bssl::internal::Deleter>._M_t.
  super__Tuple_impl<0UL,_bio_method_st_*,_bssl::internal::Deleter>.
  super__Head_base<0UL,_bio_method_st_*,_false>._M_head_impl =
       (__uniq_ptr_data<bio_method_st,_bssl::internal::Deleter,_true,_true>)
       BIO_meth_new(0,(char *)0x0);
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  gtest_ar_.success_ =
       (tuple<bio_method_st_*,_bssl::internal::Deleter>)
       bio_method._M_t.super___uniq_ptr_impl<bio_method_st,_bssl::internal::Deleter>._M_t.
       super__Tuple_impl<0UL,_bio_method_st_*,_bssl::internal::Deleter>.
       super__Head_base<0UL,_bio_method_st_*,_false>._M_head_impl !=
       (_Head_base<0UL,_bio_method_st_*,_false>)0x0;
  if ((tuple<bio_method_st_*,_bssl::internal::Deleter>)
      bio_method._M_t.super___uniq_ptr_impl<bio_method_st,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_bio_method_st_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_bio_method_st_*,_false>._M_head_impl ==
      (_Head_base<0UL,_bio_method_st_*,_false>)0x0) {
    testing::Message::Message((Message *)&client_bio);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar,(internal *)&gtest_ar_,(AssertionResult *)"bio_method","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&server_bio,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
               ,0x2036,(char *)gtest_ar._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&server_bio,(Message *)&client_bio);
  }
  else {
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_.message_);
    iVar2 = BIO_meth_set_read((BIO_METHOD *)
                              bio_method._M_t.
                              super___uniq_ptr_impl<bio_method_st,_bssl::internal::Deleter>._M_t.
                              super__Tuple_impl<0UL,_bio_method_st_*,_bssl::internal::Deleter>.
                              super__Head_base<0UL,_bio_method_st_*,_false>._M_head_impl,
                              TestBody::anon_class_1_0_00000001::__invoke);
    gtest_ar_.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0x0;
    gtest_ar_.success_ = iVar2 != 0;
    if (iVar2 == 0) {
      testing::Message::Message((Message *)&client_bio);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar,(internal *)&gtest_ar_,
                 (AssertionResult *)
                 "BIO_meth_set_read( bio_method.get(), [](BIO *bio, char *out, int len) -> int { SSL *ssl = static_cast<SSL *>(BIO_get_data(bio)); int ret = SSL_read(ssl, out, len); int ssl_ret = SSL_get_error(ssl, ret); if (ssl_ret == 2) { BIO_set_retry_read(bio); } return ret; })"
                 ,"false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&server_bio,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                 ,0x2040,(char *)gtest_ar._0_8_);
      testing::internal::AssertHelper::operator=((AssertHelper *)&server_bio,(Message *)&client_bio)
      ;
    }
    else {
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar_.message_);
      iVar2 = BIO_meth_set_write((BIO_METHOD *)
                                 bio_method._M_t.
                                 super___uniq_ptr_impl<bio_method_st,_bssl::internal::Deleter>._M_t.
                                 super__Tuple_impl<0UL,_bio_method_st_*,_bssl::internal::Deleter>.
                                 super__Head_base<0UL,_bio_method_st_*,_false>._M_head_impl,
                                 TestBody::anon_class_1_0_00000001::__invoke);
      gtest_ar_.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )0x0;
      gtest_ar_.success_ = iVar2 != 0;
      if (iVar2 == 0) {
        testing::Message::Message((Message *)&client_bio);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar,(internal *)&gtest_ar_,
                   (AssertionResult *)
                   "BIO_meth_set_write( bio_method.get(), [](BIO *bio, const char *in, int len) -> int { SSL *ssl = static_cast<SSL *>(BIO_get_data(bio)); int ret = SSL_write(ssl, in, len); int ssl_ret = SSL_get_error(ssl, ret); if (ssl_ret == 3) { BIO_set_retry_write(bio); } return ret; })"
                   ,"false","true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&server_bio,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                   ,0x204a,(char *)gtest_ar._0_8_);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&server_bio,(Message *)&client_bio);
      }
      else {
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar_.message_);
        iVar2 = BIO_meth_set_ctrl((BIO_METHOD *)
                                  bio_method._M_t.
                                  super___uniq_ptr_impl<bio_method_st,_bssl::internal::Deleter>._M_t
                                  .super__Tuple_impl<0UL,_bio_method_st_*,_bssl::internal::Deleter>.
                                  super__Head_base<0UL,_bio_method_st_*,_false>._M_head_impl,
                                  TestBody::anon_class_1_0_00000001::__invoke);
        gtest_ar_.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
              )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )0x0;
        gtest_ar_.success_ = iVar2 != 0;
        if (iVar2 != 0) {
          std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr(&gtest_ar_.message_);
          client_bio._M_t.super___uniq_ptr_impl<bio_st,_bssl::internal::Deleter>._M_t.
          super__Tuple_impl<0UL,_bio_st_*,_bssl::internal::Deleter>.
          super__Head_base<0UL,_bio_st_*,_false>._M_head_impl =
               (__uniq_ptr_data<bio_st,_bssl::internal::Deleter,_true,_true>)
               BIO_new((BIO_METHOD *)
                       bio_method._M_t.super___uniq_ptr_impl<bio_method_st,_bssl::internal::Deleter>
                       ._M_t.super__Tuple_impl<0UL,_bio_method_st_*,_bssl::internal::Deleter>.
                       super__Head_base<0UL,_bio_method_st_*,_false>._M_head_impl);
          gtest_ar_.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl =
               (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )0x0;
          gtest_ar_.success_ =
               (tuple<bio_st_*,_bssl::internal::Deleter>)
               client_bio._M_t.super___uniq_ptr_impl<bio_st,_bssl::internal::Deleter>._M_t.
               super__Tuple_impl<0UL,_bio_st_*,_bssl::internal::Deleter>.
               super__Head_base<0UL,_bio_st_*,_false>._M_head_impl !=
               (_Head_base<0UL,_bio_st_*,_false>)0x0;
          if ((tuple<bio_st_*,_bssl::internal::Deleter>)
              client_bio._M_t.super___uniq_ptr_impl<bio_st,_bssl::internal::Deleter>._M_t.
              super__Tuple_impl<0UL,_bio_st_*,_bssl::internal::Deleter>.
              super__Head_base<0UL,_bio_st_*,_false>._M_head_impl ==
              (_Head_base<0UL,_bio_st_*,_false>)0x0) {
            testing::Message::Message((Message *)&server_bio);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)&gtest_ar,(internal *)&gtest_ar_,(AssertionResult *)"client_bio",
                       "false","true",in_R9);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&client_outer,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                       ,0x2055,(char *)gtest_ar._0_8_);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&client_outer,(Message *)&server_bio);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&client_outer);
            std::__cxx11::string::~string((string *)&gtest_ar);
            if ((__uniq_ptr_impl<bio_st,_bssl::internal::Deleter>)
                server_bio._M_t.super___uniq_ptr_impl<bio_st,_bssl::internal::Deleter>._M_t.
                super__Tuple_impl<0UL,_bio_st_*,_bssl::internal::Deleter>.
                super__Head_base<0UL,_bio_st_*,_false>._M_head_impl !=
                (__uniq_ptr_impl<bio_st,_bssl::internal::Deleter>)0x0) {
              (**(code **)(*(long *)server_bio._M_t.
                                    super___uniq_ptr_impl<bio_st,_bssl::internal::Deleter>._M_t.
                                    super__Tuple_impl<0UL,_bio_st_*,_bssl::internal::Deleter>.
                                    super__Head_base<0UL,_bio_st_*,_false>._M_head_impl + 8))();
            }
            std::
            unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~unique_ptr(&gtest_ar_.message_);
          }
          else {
            std::
            unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~unique_ptr(&gtest_ar_.message_);
            BIO_set_data((BIO *)client_bio._M_t.
                                super___uniq_ptr_impl<bio_st,_bssl::internal::Deleter>._M_t.
                                super__Tuple_impl<0UL,_bio_st_*,_bssl::internal::Deleter>.
                                super__Head_base<0UL,_bio_st_*,_false>._M_head_impl,
                         (this->super_SSLVersionTest).client_._M_t.
                         super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
                         super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                         super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl);
            BIO_set_init((BIO *)client_bio._M_t.
                                super___uniq_ptr_impl<bio_st,_bssl::internal::Deleter>._M_t.
                                super__Tuple_impl<0UL,_bio_st_*,_bssl::internal::Deleter>.
                                super__Head_base<0UL,_bio_st_*,_false>._M_head_impl,1);
            server_bio._M_t.super___uniq_ptr_impl<bio_st,_bssl::internal::Deleter>._M_t.
            super__Tuple_impl<0UL,_bio_st_*,_bssl::internal::Deleter>.
            super__Head_base<0UL,_bio_st_*,_false>._M_head_impl =
                 (__uniq_ptr_data<bio_st,_bssl::internal::Deleter,_true,_true>)
                 BIO_new((BIO_METHOD *)
                         bio_method._M_t.
                         super___uniq_ptr_impl<bio_method_st,_bssl::internal::Deleter>._M_t.
                         super__Tuple_impl<0UL,_bio_method_st_*,_bssl::internal::Deleter>.
                         super__Head_base<0UL,_bio_method_st_*,_false>._M_head_impl);
            gtest_ar_.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl =
                 (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                  )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )0x0;
            gtest_ar_.success_ =
                 (tuple<bio_st_*,_bssl::internal::Deleter>)
                 server_bio._M_t.super___uniq_ptr_impl<bio_st,_bssl::internal::Deleter>._M_t.
                 super__Tuple_impl<0UL,_bio_st_*,_bssl::internal::Deleter>.
                 super__Head_base<0UL,_bio_st_*,_false>._M_head_impl !=
                 (_Head_base<0UL,_bio_st_*,_false>)0x0;
            if ((tuple<bio_st_*,_bssl::internal::Deleter>)
                server_bio._M_t.super___uniq_ptr_impl<bio_st,_bssl::internal::Deleter>._M_t.
                super__Tuple_impl<0UL,_bio_st_*,_bssl::internal::Deleter>.
                super__Head_base<0UL,_bio_st_*,_false>._M_head_impl ==
                (_Head_base<0UL,_bio_st_*,_false>)0x0) {
              testing::Message::Message((Message *)&client_outer);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)&gtest_ar,(internal *)&gtest_ar_,(AssertionResult *)"server_bio",
                         "false","true",in_R9);
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&server_outer,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                         ,0x205a,(char *)gtest_ar._0_8_);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&server_outer,(Message *)&client_outer);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&server_outer);
              std::__cxx11::string::~string((string *)&gtest_ar);
              if ((__uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>)
                  client_outer._M_t.super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
                  super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                  super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl !=
                  (__uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>)0x0) {
                (**(code **)(*(long *)client_outer._M_t.
                                      super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
                                      super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                                      super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl + 8))();
              }
              std::
              unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~unique_ptr(&gtest_ar_.message_);
            }
            else {
              std::
              unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~unique_ptr(&gtest_ar_.message_);
              BIO_set_data((BIO *)server_bio._M_t.
                                  super___uniq_ptr_impl<bio_st,_bssl::internal::Deleter>._M_t.
                                  super__Tuple_impl<0UL,_bio_st_*,_bssl::internal::Deleter>.
                                  super__Head_base<0UL,_bio_st_*,_false>._M_head_impl,
                           (this->super_SSLVersionTest).server_._M_t.
                           super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
                           super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                           super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl);
              BIO_set_init((BIO *)server_bio._M_t.
                                  super___uniq_ptr_impl<bio_st,_bssl::internal::Deleter>._M_t.
                                  super__Tuple_impl<0UL,_bio_st_*,_bssl::internal::Deleter>.
                                  super__Head_base<0UL,_bio_st_*,_false>._M_head_impl,1);
              client_outer._M_t.super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
              super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
              super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl =
                   (__uniq_ptr_data<ssl_st,_bssl::internal::Deleter,_true,_true>)
                   SSL_new((SSL_CTX *)
                           (this->super_SSLVersionTest).client_ctx_._M_t.
                           super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                           super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                           super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl);
              gtest_ar_.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl =
                   (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                    )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )0x0;
              gtest_ar_.success_ =
                   (tuple<ssl_st_*,_bssl::internal::Deleter>)
                   client_outer._M_t.super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
                   super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                   super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl !=
                   (_Head_base<0UL,_ssl_st_*,_false>)0x0;
              if ((tuple<ssl_st_*,_bssl::internal::Deleter>)
                  client_outer._M_t.super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
                  super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                  super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl ==
                  (_Head_base<0UL,_ssl_st_*,_false>)0x0) {
                testing::Message::Message((Message *)&server_outer);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)&gtest_ar,(internal *)&gtest_ar_,
                           (AssertionResult *)"client_outer","false","true",in_R9);
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&local_d0,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                           ,0x2060,(char *)gtest_ar._0_8_);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&local_d0,(Message *)&server_outer);
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_d0);
                std::__cxx11::string::~string((string *)&gtest_ar);
                if ((__uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>)
                    server_outer._M_t.super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
                    super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                    super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl !=
                    (__uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>)0x0) {
                  (**(code **)(*(long *)server_outer._M_t.
                                        super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
                                        super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                                        super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl + 8))();
                }
                std::
                unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~unique_ptr(&gtest_ar_.message_);
              }
              else {
                std::
                unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~unique_ptr(&gtest_ar_.message_);
                SSL_set_connect_state
                          ((SSL *)client_outer._M_t.
                                  super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
                                  super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                                  super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl);
                SSL_set_bio((SSL *)client_outer._M_t.
                                   super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
                                   super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                                   super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl,
                            (BIO *)client_bio._M_t.
                                   super___uniq_ptr_impl<bio_st,_bssl::internal::Deleter>._M_t.
                                   super__Tuple_impl<0UL,_bio_st_*,_bssl::internal::Deleter>.
                                   super__Head_base<0UL,_bio_st_*,_false>._M_head_impl,
                            (BIO *)client_bio._M_t.
                                   super___uniq_ptr_impl<bio_st,_bssl::internal::Deleter>._M_t.
                                   super__Tuple_impl<0UL,_bio_st_*,_bssl::internal::Deleter>.
                                   super__Head_base<0UL,_bio_st_*,_false>._M_head_impl);
                client_bio._M_t.super___uniq_ptr_impl<bio_st,_bssl::internal::Deleter>._M_t.
                super__Tuple_impl<0UL,_bio_st_*,_bssl::internal::Deleter>.
                super__Head_base<0UL,_bio_st_*,_false>._M_head_impl =
                     (__uniq_ptr_data<bio_st,_bssl::internal::Deleter,_true,_true>)
                     (__uniq_ptr_impl<bio_st,_bssl::internal::Deleter>)0x0;
                server_outer._M_t.super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
                super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl =
                     (__uniq_ptr_data<ssl_st,_bssl::internal::Deleter,_true,_true>)
                     SSL_new((SSL_CTX *)
                             (this->super_SSLVersionTest).server_ctx_._M_t.
                             super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                             super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                             super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl);
                gtest_ar_.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl =
                     (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                      )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )0x0;
                gtest_ar_.success_ =
                     (tuple<ssl_st_*,_bssl::internal::Deleter>)
                     server_outer._M_t.super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
                     super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                     super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl !=
                     (_Head_base<0UL,_ssl_st_*,_false>)0x0;
                if ((tuple<ssl_st_*,_bssl::internal::Deleter>)
                    server_outer._M_t.super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
                    super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                    super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl ==
                    (_Head_base<0UL,_ssl_st_*,_false>)0x0) {
                  testing::Message::Message((Message *)&local_d0);
                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                            ((string *)&gtest_ar,(internal *)&gtest_ar_,
                             (AssertionResult *)"server_outer","false","true",in_R9);
                  testing::internal::AssertHelper::AssertHelper
                            (&local_a0,kFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                             ,0x2066,(char *)gtest_ar._0_8_);
                  testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_d0);
                  testing::internal::AssertHelper::~AssertHelper(&local_a0);
                  std::__cxx11::string::~string((string *)&gtest_ar);
                  if (local_d0._M_head_impl !=
                      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
                     ) {
                    (**(code **)(*(long *)local_d0._M_head_impl + 8))();
                  }
LAB_001afbe2:
                  std::
                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::~unique_ptr(&gtest_ar_.message_);
                }
                else {
                  std::
                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::~unique_ptr(&gtest_ar_.message_);
                  SSL_set_accept_state
                            ((SSL *)server_outer._M_t.
                                    super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
                                    super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                                    super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl);
                  SSL_set_bio((SSL *)server_outer._M_t.
                                     super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
                                     super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                                     super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl,
                              (BIO *)server_bio._M_t.
                                     super___uniq_ptr_impl<bio_st,_bssl::internal::Deleter>._M_t.
                                     super__Tuple_impl<0UL,_bio_st_*,_bssl::internal::Deleter>.
                                     super__Head_base<0UL,_bio_st_*,_false>._M_head_impl,
                              (BIO *)server_bio._M_t.
                                     super___uniq_ptr_impl<bio_st,_bssl::internal::Deleter>._M_t.
                                     super__Tuple_impl<0UL,_bio_st_*,_bssl::internal::Deleter>.
                                     super__Head_base<0UL,_bio_st_*,_false>._M_head_impl);
                  server_bio._M_t.super___uniq_ptr_impl<bio_st,_bssl::internal::Deleter>._M_t.
                  super__Tuple_impl<0UL,_bio_st_*,_bssl::internal::Deleter>.
                  super__Head_base<0UL,_bio_st_*,_false>._M_head_impl =
                       (__uniq_ptr_data<bio_st,_bssl::internal::Deleter,_true,_true>)
                       (__uniq_ptr_impl<bio_st,_bssl::internal::Deleter>)0x0;
                  SSL_set_custom_verify
                            ((SSL *)client_outer._M_t.
                                    super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
                                    super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                                    super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl,1,
                             TestBody::anon_class_1_0_00000001::__invoke);
                  do {
                    iVar2 = SSL_do_handshake((SSL *)client_outer._M_t.
                                                                                                        
                                                  super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>
                                                  .super__Head_base<0UL,_ssl_st_*,_false>.
                                                  _M_head_impl);
                    client_err = SSL_get_error((SSL *)client_outer._M_t.
                                                                                                            
                                                  super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>
                                                  .super__Head_base<0UL,_ssl_st_*,_false>.
                                                  _M_head_impl,iVar2);
                    if (client_err - 4U < 0xfffffffe) {
                      gtest_ar_.success_ = true;
                      gtest_ar_._1_3_ = 0;
                      testing::internal::CmpHelperEQ<int,int>
                                ((internal *)&gtest_ar,"1","client_err",(int *)&gtest_ar_,
                                 &client_err);
                      if (gtest_ar.success_ == false) {
                        testing::Message::Message((Message *)&gtest_ar_);
                        if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             )gtest_ar.message_._M_t.
                              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                              ._M_head_impl ==
                            (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             )0x0) {
                          message = "";
                        }
                        else {
                          message = *(char **)gtest_ar.message_._M_t.
                                              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              ._M_t.
                                              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              .
                                              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                              ._M_head_impl;
                        }
                        testing::internal::AssertHelper::AssertHelper
                                  ((AssertHelper *)&local_d0,kNonFatalFailure,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                                   ,0x2079,message);
                        testing::internal::AssertHelper::operator=
                                  ((AssertHelper *)&local_d0,(Message *)&gtest_ar_);
                        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_d0);
                        if ((long *)CONCAT44(gtest_ar_._4_4_,gtest_ar_._0_4_) != (long *)0x0) {
                          (**(code **)(*(long *)CONCAT44(gtest_ar_._4_4_,gtest_ar_._0_4_) + 8))();
                        }
                      }
                      std::
                      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::~unique_ptr(&gtest_ar.message_);
                      uVar4 = ERR_peek_error();
                      ErrorEquals((uint32_t)&gtest_ar_,(int)uVar4,0x10);
                      if (gtest_ar_.success_ == false) {
                        testing::Message::Message((Message *)&local_d0);
                        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                  ((string *)&gtest_ar,(internal *)&gtest_ar_,
                                   (AssertionResult *)
                                   "ErrorEquals(ERR_peek_error(), ERR_LIB_SSL, 125)","false","true",
                                   in_R9);
                        testing::internal::AssertHelper::AssertHelper
                                  (&local_a0,kNonFatalFailure,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                                   ,0x207b,(char *)gtest_ar._0_8_);
                        testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_d0);
                        testing::internal::AssertHelper::~AssertHelper(&local_a0);
                        std::__cxx11::string::~string((string *)&gtest_ar);
                        if (local_d0._M_head_impl !=
                            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                             *)0x0) {
                          (**(code **)(*(long *)local_d0._M_head_impl + 8))();
                        }
                      }
                      goto LAB_001afbe2;
                    }
                    iVar2 = SSL_do_handshake((SSL *)server_outer._M_t.
                                                                                                        
                                                  super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>
                                                  .super__Head_base<0UL,_ssl_st_*,_false>.
                                                  _M_head_impl);
                    uVar3 = SSL_get_error((SSL *)server_outer._M_t.
                                                 super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>
                                                 ._M_t.
                                                 super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>
                                                 .super__Head_base<0UL,_ssl_st_*,_false>.
                                                 _M_head_impl,iVar2);
                    gtest_ar_.message_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl =
                         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )0x0;
                    gtest_ar_.success_ = uVar3 == 3 || (uVar3 & 0xfffffffd) == 0;
                    if ((3 < uVar3) || (uVar3 == 1)) {
                      testing::Message::Message((Message *)&local_d0);
                      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                ((string *)&gtest_ar,(internal *)&gtest_ar_,
                                 (AssertionResult *)
                                 "server_err == 0 || server_err == 2 || server_err == 3","false",
                                 "true",in_R9);
                      testing::internal::AssertHelper::AssertHelper
                                (&local_a0,kFatalFailure,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                                 ,0x2084,(char *)gtest_ar._0_8_);
                      testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_d0);
                      testing::internal::AssertHelper::~AssertHelper(&local_a0);
                      std::__cxx11::string::~string((string *)&gtest_ar);
                      if (local_d0._M_head_impl !=
                          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *
                          )0x0) {
                        (**(code **)(*(long *)local_d0._M_head_impl + 8))();
                      }
                    }
                    std::
                    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::~unique_ptr(&gtest_ar_.message_);
                  } while ((uVar3 < 4) && (uVar3 != 1));
                }
                std::unique_ptr<ssl_st,_bssl::internal::Deleter>::~unique_ptr(&server_outer);
              }
              std::unique_ptr<ssl_st,_bssl::internal::Deleter>::~unique_ptr(&client_outer);
            }
            std::unique_ptr<bio_st,_bssl::internal::Deleter>::~unique_ptr(&server_bio);
          }
          std::unique_ptr<bio_st,_bssl::internal::Deleter>::~unique_ptr(&client_bio);
          goto LAB_001af850;
        }
        testing::Message::Message((Message *)&client_bio);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar,(internal *)&gtest_ar_,
                   (AssertionResult *)
                   "BIO_meth_set_ctrl( bio_method.get(), [](BIO *bio, int cmd, long larg, void *parg) -> long { if (cmd == 11) { return 1; } return 0; })"
                   ,"false","true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&server_bio,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                   ,0x2052,(char *)gtest_ar._0_8_);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&server_bio,(Message *)&client_bio);
      }
    }
  }
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&server_bio);
  std::__cxx11::string::~string((string *)&gtest_ar);
  if ((__uniq_ptr_impl<bio_st,_bssl::internal::Deleter>)
      client_bio._M_t.super___uniq_ptr_impl<bio_st,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_bio_st_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_bio_st_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<bio_st,_bssl::internal::Deleter>)0x0) {
    (**(code **)(*(long *)client_bio._M_t.super___uniq_ptr_impl<bio_st,_bssl::internal::Deleter>.
                          _M_t.super__Tuple_impl<0UL,_bio_st_*,_bssl::internal::Deleter>.
                          super__Head_base<0UL,_bio_st_*,_false>._M_head_impl + 8))();
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
LAB_001af850:
  std::unique_ptr<bio_method_st,_bssl::internal::Deleter>::~unique_ptr(&bio_method);
  return;
}

Assistant:

TEST_P(SSLVersionTest, DoubleSSLError) {
  // Connect the inner SSL connections.
  ASSERT_TRUE(Connect());

  // Make a pair of |BIO|s which wrap |client_| and |server_|.
  UniquePtr<BIO_METHOD> bio_method(BIO_meth_new(0, nullptr));
  ASSERT_TRUE(bio_method);
  ASSERT_TRUE(BIO_meth_set_read(
      bio_method.get(), [](BIO *bio, char *out, int len) -> int {
        SSL *ssl = static_cast<SSL *>(BIO_get_data(bio));
        int ret = SSL_read(ssl, out, len);
        int ssl_ret = SSL_get_error(ssl, ret);
        if (ssl_ret == SSL_ERROR_WANT_READ) {
          BIO_set_retry_read(bio);
        }
        return ret;
      }));
  ASSERT_TRUE(BIO_meth_set_write(
      bio_method.get(), [](BIO *bio, const char *in, int len) -> int {
        SSL *ssl = static_cast<SSL *>(BIO_get_data(bio));
        int ret = SSL_write(ssl, in, len);
        int ssl_ret = SSL_get_error(ssl, ret);
        if (ssl_ret == SSL_ERROR_WANT_WRITE) {
          BIO_set_retry_write(bio);
        }
        return ret;
      }));
  ASSERT_TRUE(BIO_meth_set_ctrl(
      bio_method.get(), [](BIO *bio, int cmd, long larg, void *parg) -> long {
        // |SSL| objects require |BIO_flush| support.
        if (cmd == BIO_CTRL_FLUSH) {
          return 1;
        }
        return 0;
      }));

  UniquePtr<BIO> client_bio(BIO_new(bio_method.get()));
  ASSERT_TRUE(client_bio);
  BIO_set_data(client_bio.get(), client_.get());
  BIO_set_init(client_bio.get(), 1);

  UniquePtr<BIO> server_bio(BIO_new(bio_method.get()));
  ASSERT_TRUE(server_bio);
  BIO_set_data(server_bio.get(), server_.get());
  BIO_set_init(server_bio.get(), 1);

  // Wrap the inner connections in another layer of SSL.
  UniquePtr<SSL> client_outer(SSL_new(client_ctx_.get()));
  ASSERT_TRUE(client_outer);
  SSL_set_connect_state(client_outer.get());
  SSL_set_bio(client_outer.get(), client_bio.get(), client_bio.get());
  client_bio.release();  // |SSL_set_bio| takes ownership.

  UniquePtr<SSL> server_outer(SSL_new(server_ctx_.get()));
  ASSERT_TRUE(server_outer);
  SSL_set_accept_state(server_outer.get());
  SSL_set_bio(server_outer.get(), server_bio.get(), server_bio.get());
  server_bio.release();  // |SSL_set_bio| takes ownership.

  // Configure |client_outer| to reject the server certificate.
  SSL_set_custom_verify(
      client_outer.get(), SSL_VERIFY_PEER,
      [](SSL *ssl, uint8_t *out_alert) -> ssl_verify_result_t {
        return ssl_verify_invalid;
      });

  for (;;) {
    int client_ret = SSL_do_handshake(client_outer.get());
    int client_err = SSL_get_error(client_outer.get(), client_ret);
    if (client_err != SSL_ERROR_WANT_READ &&
        client_err != SSL_ERROR_WANT_WRITE) {
      // The client handshake should terminate on a certificate verification
      // error.
      EXPECT_EQ(SSL_ERROR_SSL, client_err);
      EXPECT_TRUE(ErrorEquals(ERR_peek_error(), ERR_LIB_SSL,
                              SSL_R_CERTIFICATE_VERIFY_FAILED));
      break;
    }

    // Run the server handshake and continue.
    int server_ret = SSL_do_handshake(server_outer.get());
    int server_err = SSL_get_error(server_outer.get(), server_ret);
    ASSERT_TRUE(server_err == SSL_ERROR_NONE ||
                server_err == SSL_ERROR_WANT_READ ||
                server_err == SSL_ERROR_WANT_WRITE);
  }
}